

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O0

void __thiscall
TLeonardoHeap<double>::TLeonardoHeap(TLeonardoHeap<double> *this,double *_data,size_t _N)

{
  ulong local_28;
  size_t i;
  size_t _N_local;
  double *_data_local;
  TLeonardoHeap<double> *this_local;
  
  this->data = _data;
  this->N = _N;
  this->tree_vector = 3;
  this->first_tree = 0;
  if ((1 < this->N) && (this->data[1] <= *this->data && *this->data != this->data[1])) {
    swap(this,0,1);
  }
  for (local_28 = 2; local_28 < this->N; local_28 = local_28 + 1) {
    insertion_sort(this,local_28);
  }
  return;
}

Assistant:

TLeonardoHeap<T>::TLeonardoHeap(T* _data, size_t _N) : data(_data) , N(_N) {
	// Initialize the heap with the first two elements
	tree_vector = 3;
	first_tree = 0;
	if(N > 1) { if(data[0] > data[1]) { swap(0, 1); } }
	// Insert each element sequentially
	for(size_t i=2; i<N; i++) { insertion_sort(i); }
}